

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_AllGreen_Test::TEST_DoublingFactorCounterTest_AllGreen_Test
          (TEST_DoublingFactorCounterTest_AllGreen_Test *this)

{
  TEST_DoublingFactorCounterTest_AllGreen_Test *this_local;
  
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest);
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_DoublingFactorCounterTest_AllGreen_Test_002527c8;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, AllGreen)
{
	addPair(Tile::GreenDragon);
	addTriplet(Tile::TwoOfBamboos, false);
	addSequence(Tile::TwoOfBamboos, false);
	addTriplet(Tile::SixOfBamboos, false);
	addTriplet(Tile::EightOfBamboos, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllGreen));
	CHECK_EQUAL(100, r.doubling_factor);
}